

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O0

_Bool get_item_allow(object *obj,uchar ch,cmd_code cmd,_Bool is_harmless)

{
  _Bool _Var1;
  uint uVar2;
  char *local_430;
  char *verb;
  char prompt_buf [1024];
  uint n;
  char verify_inscrip [3];
  _Bool is_harmless_local;
  cmd_code cmd_local;
  uchar ch_local;
  object *obj_local;
  
  prompt_buf[0x3fe] = '\0';
  is_harmless_local = (_Bool)ch;
  if (ch < 0x20) {
    is_harmless_local = (_Bool)(ch + '@');
  }
  prompt_buf[0x3fd] = is_harmless_local;
  prompt_buf[0x3fc] = '!';
  prompt_buf[0x3ff] = is_harmless;
  prompt_buf._1016_4_ = check_for_inscrip(obj,prompt_buf + 0x3fc);
  if ((prompt_buf[0x3ff] & 1U) == 0) {
    uVar2 = check_for_inscrip(obj,"!*");
    prompt_buf._1016_4_ = uVar2 + prompt_buf._1016_4_;
  }
  if (prompt_buf._1016_4_ == 0) {
LAB_0025fda2:
    obj_local._7_1_ = true;
  }
  else {
    local_430 = cmd_verb(cmd);
    if (local_430 == (char *)0x0) {
      local_430 = "do that with";
    }
    strnfmt((char *)&verb,0x400,"Really %s",local_430);
    do {
      if (prompt_buf._1016_4_ == 0) goto LAB_0025fda2;
      prompt_buf._1016_4_ = prompt_buf._1016_4_ + -1;
      _Var1 = verify_object((char *)&verb,obj,player);
    } while (_Var1);
    obj_local._7_1_ = false;
  }
  return obj_local._7_1_;
}

Assistant:

bool get_item_allow(const struct object *obj, unsigned char ch, cmd_code cmd,
					bool is_harmless)
{
	char verify_inscrip[] = "!*";

	unsigned n;

	/*
	 * Hack - Only shift the command key if it actually needs to be shifted.
	 * Because UN_KTRL('ctrl-d') (i.e. rogue-like ignore command) gives 'd'
	 * which is the drop command in both keysets, use UN_KTRL_CAP().
	 */
	if (ch < 0x20)
		ch = UN_KTRL_CAP(ch);

	/* The inscription to look for */
	verify_inscrip[1] = ch;

	/* Look for the inscription */
	n = check_for_inscrip(obj, verify_inscrip);

	/* Also look for the inscription '!*' */
	if (!is_harmless)
		n += check_for_inscrip(obj, "!*");

	/* Choose string for the prompt */
	if (n) {
		char prompt_buf[1024];

		const char *verb = cmd_verb(cmd);
		if (!verb)
			verb = "do that with";

		strnfmt(prompt_buf, sizeof(prompt_buf), "Really %s", verb);

		/* Prompt for confirmation n times */
		while (n--) {
			if (!verify_object(prompt_buf, obj, player)) {
				return false;
			}
		}
	}

	/* Allow it */
	return (true);
}